

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_file_encryption(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  ulonglong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  ushort uVar5;
  int iVar6;
  
  iVar6 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  pcVar4 = argv[1];
  iVar1 = strcasecmp(pcVar4,"none");
  if (iVar1 == 0) {
    uVar5 = 0;
  }
  else {
    iVar1 = strcasecmp(pcVar4,"PKWARE");
    if (iVar1 == 0) {
      uVar5 = 1;
    }
    else {
      iVar1 = strcasecmp(pcVar4,"AES-128");
      if (iVar1 == 0) {
        uVar5 = 0x101;
      }
      else {
        iVar1 = strcasecmp(pcVar4,"AES-192");
        if (iVar1 == 0) {
          uVar5 = 0x102;
        }
        else {
          iVar1 = strcasecmp(pcVar4,"AES-256");
          if (iVar1 == 0) {
            uVar5 = 0x103;
          }
          else {
            iVar1 = strcasecmp(pcVar4,"unknown");
            uVar5 = -(ushort)(iVar1 != 0) | 100;
          }
        }
      }
    }
  }
  pcVar4 = (char *)0x0;
  if (*argv[2] != '\0') {
    pcVar4 = argv[2];
  }
  iVar1 = zip_file_set_encryption(za,uVar2,uVar5,pcVar4);
  __stream = _stderr;
  if (iVar1 < 0) {
    pcVar4 = argv[1];
    uVar3 = zip_strerror(za);
    fprintf(__stream,"can\'t set file encryption method at index \'%lu\' to \'%s\': %s\n",uVar2,
            pcVar4,uVar3);
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int
set_file_encryption(int argc, char *argv[]) {
    zip_uint16_t method;
    zip_uint64_t idx;
    char *password;
    idx = strtoull(argv[0], NULL, 10);
    method = get_encryption_method(argv[1]);
    password = argv[2];
    if (strlen(password) == 0) {
	password = NULL;
    }
    if (zip_file_set_encryption(za, idx, method, password) < 0) {
	fprintf(stderr, "can't set file encryption method at index '%" PRIu64 "' to '%s': %s\n", idx, argv[1], zip_strerror(za));
	return -1;
    }
    return 0;
}